

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *pTVar1;
  char *in_RSI;
  char *in_RDI;
  TestInfo *test_info;
  CodeLocation *in_stack_fffffffffffffee8;
  CodeLocation *in_stack_fffffffffffffef0;
  TestInfo *in_stack_ffffffffffffff48;
  TearDownTestCaseFunc in_stack_ffffffffffffff50;
  SetUpTestCaseFunc in_stack_ffffffffffffff58;
  UnitTestImpl *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [24];
  CodeLocation *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  TestInfo *in_stack_ffffffffffffffb0;
  TypeId in_stack_ffffffffffffffc0;
  TestFactoryBase *in_stack_ffffffffffffffc8;
  
  pTVar1 = (TestInfo *)operator_new(0x108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa8,in_RDI,(allocator *)&stack0xffffffffffffffa7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,in_RSI,&local_91);
  CodeLocation::CodeLocation(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  TestInfo::TestInfo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  CodeLocation::~CodeLocation((CodeLocation *)0x17c8f7);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  GetUnitTestImpl();
  UnitTestImpl::AddTestInfo
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  return pTVar1;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    CodeLocation code_location,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}